

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

char * fread_word(FILE *fp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  char *pcVar5;
  string_view fmt;
  
  do {
    uVar1 = getc((FILE *)fp);
    iVar2 = isspace((int)(char)uVar1);
  } while (iVar2 != 0);
  if ((uVar1 << 0x18 == 0x27000000) || (uVar1 << 0x18 == 0x22000000)) {
    uVar3 = uVar1 & 0x27;
    pcVar5 = fread_word::word;
  }
  else {
    uVar3 = 0x20;
    pcVar5 = fread_word::word + 1;
    fread_word::word[0] = (char)uVar1;
  }
  while( true ) {
    iVar2 = getc((FILE *)fp);
    cVar4 = (char)iVar2;
    *pcVar5 = cVar4;
    if (uVar3 == 0x20) {
      uVar1 = isspace((int)cVar4);
    }
    else {
      uVar1 = (uint)((int)cVar4 == uVar3);
    }
    if (uVar1 != 0) break;
    pcVar5 = pcVar5 + 1;
    if (fread_word::word + 0x11ff < pcVar5) {
      fmt._M_str = "Fread_word: word too long [{}].";
      fmt._M_len = 0x1f;
      CLogger::Error<char(&)[4608]>((CLogger *)&RS.field_0x140,fmt,&fread_word::word);
      exit(1);
    }
  }
  if (uVar3 == 0x20) {
    ungetc((int)cVar4,(FILE *)fp);
  }
  *pcVar5 = '\0';
  return fread_word::word;
}

Assistant:

char *fread_word(FILE *fp)
{
	static char word[MAX_INPUT_LENGTH];
	char *pword;
	char cEnd;

	do
	{
		cEnd = getc(fp);
	} while (isspace(cEnd));

	if (cEnd == '\'' || cEnd == '"')
	{
		pword = word;
	}
	else
	{
		word[0] = cEnd;
		pword = word + 1;
		cEnd = ' ';
	}

	for (; pword < word + MAX_INPUT_LENGTH; pword++)
	{
		*pword = getc(fp);
		if (cEnd == ' ' ? isspace(*pword) : *pword == cEnd)
		{
			if (cEnd == ' ')
				ungetc(*pword, fp);

			*pword = '\0';
			return word;
		}
	}

	RS.Logger.Error("Fread_word: word too long [{}].", word);
	exit(1);
	return nullptr;
}